

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O0

void TestBignumDtoaGayShortest(void)

{
  int iVar1;
  PrecomputedShortest *pPVar2;
  Vector<const_double_conversion::PrecomputedShortest> VVar3;
  double v;
  PrecomputedShortest current_test;
  int i;
  Vector<const_double_conversion::PrecomputedShortest> precomputed;
  int point;
  int length;
  Vector<char> buffer;
  char buffer_container [100];
  int *in_stack_000007e0;
  int *in_stack_000007e8;
  int in_stack_000007f0;
  BignumDtoaMode in_stack_000007f4;
  double in_stack_000007f8;
  Vector<char> in_stack_00000800;
  char *in_stack_ffffffffffffff18;
  int value;
  undefined4 in_stack_ffffffffffffff20;
  int iVar4;
  char *expected;
  char *expected_source;
  char *pcVar5;
  char *file;
  int local_a4;
  Vector<const_double_conversion::PrecomputedShortest> local_90;
  undefined1 local_78 [16];
  char local_68 [104];
  
  double_conversion::Vector<char>::Vector((Vector<char> *)local_78,local_68,100);
  VVar3 = double_conversion::PrecomputedShortestRepresentations();
  local_90.start_ = VVar3.start_;
  local_90.length_ = VVar3.length_;
  local_a4 = 0;
  while( true ) {
    value = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    iVar4 = local_a4;
    iVar1 = double_conversion::Vector<const_double_conversion::PrecomputedShortest>::length
                      (&local_90);
    if (iVar1 <= iVar4) break;
    pPVar2 = double_conversion::Vector<const_double_conversion::PrecomputedShortest>::operator[]
                       (&local_90,local_a4);
    pcVar5 = (char *)pPVar2->v;
    in_stack_ffffffffffffff18 = pPVar2->representation;
    expected = (char *)local_78._0_8_;
    expected_source = (char *)local_78._8_8_;
    file = pcVar5;
    double_conversion::BignumDtoa
              (in_stack_000007f8,in_stack_000007f4,in_stack_000007f0,in_stack_00000800,
               in_stack_000007e8,in_stack_000007e0);
    iVar1 = (int)((ulong)pcVar5 >> 0x20);
    CheckEqualsHelper(file,iVar1,expected_source,(int)((ulong)expected >> 0x20),
                      (char *)CONCAT44(iVar4,in_stack_ffffffffffffff20),value);
    double_conversion::Vector<char>::start((Vector<char> *)local_78);
    CheckEqualsHelper(file,iVar1,expected_source,expected,
                      (char *)CONCAT44(iVar4,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
    local_a4 = local_a4 + 1;
  }
  return;
}

Assistant:

TEST(BignumDtoaGayShortest) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  Vector<const PrecomputedShortest> precomputed =
      PrecomputedShortestRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedShortest current_test = precomputed[i];
    double v = current_test.v;
    BignumDtoa(v, BIGNUM_DTOA_SHORTEST, 0, buffer, &length, &point);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}